

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcpstream.cpp
# Opt level: O0

TCPStream * __thiscall TCPStream::getPeerIP_abi_cxx11_(TCPStream *this)

{
  long in_RSI;
  TCPStream *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)(in_RSI + 8));
  return this;
}

Assistant:

std::string TCPStream::getPeerIP()
{
    return m_peerIP;
}